

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderRenderingPointsCase::GeometryShaderRenderingPointsCase
          (GeometryShaderRenderingPointsCase *this,Context *context,ExtParameters *extParams,
          char *name,GLenum drawcall_mode,_shader_output_type output_type)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  float *pfVar7;
  uchar *puVar8;
  TestError *pTVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  uint rendertarget_width;
  uint rendertarget_height;
  undefined8 local_28;
  
  TestCaseBase::TestCaseBase
            ((TestCaseBase *)this,context,extParams,name,
             "Verifies all draw calls work correctly for specific input+output+draw call mode combination"
            );
  (this->super_GeometryShaderRenderingCase).m_context = context;
  (this->super_GeometryShaderRenderingCase).m_instanced_raw_arrays_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_instanced_unordered_arrays_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_instanced_unordered_elements_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_noninstanced_raw_arrays_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_noninstanced_unordered_arrays_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_noninstanced_unordered_elements_bo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_fs_id = 0;
  (this->super_GeometryShaderRenderingCase).m_gs_id = 0;
  (this->super_GeometryShaderRenderingCase).m_po_id = 0;
  (this->super_GeometryShaderRenderingCase).m_renderingTargetSize_uniform_location = 0;
  (this->super_GeometryShaderRenderingCase).m_singleRenderingTargetSize_uniform_location = 0;
  (this->super_GeometryShaderRenderingCase).m_vao_id = 0;
  (this->super_GeometryShaderRenderingCase).m_vs_id = 0;
  (this->super_GeometryShaderRenderingCase).m_fbo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_read_fbo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_to_id = 0;
  (this->super_GeometryShaderRenderingCase).m_to_id = 0;
  (this->super_GeometryShaderRenderingCase).m_instanced_fbo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_instanced_read_fbo_id = 0;
  (this->super_GeometryShaderRenderingCase).m_instanced_to_id = 0;
  (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderingPointsCase_021067c0;
  *(_shader_output_type *)&(this->super_GeometryShaderRenderingCase).field_0x304 = output_type;
  if (drawcall_mode == 0) {
    if (output_type < SHADER_OUTPUT_TYPE_COUNT) {
      local_28 = 0;
      getRenderTargetSize(this,1,(uint *)&local_28,(uint *)((long)&local_28 + 4));
      uVar5 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                super_TestNode._vptr_TestNode[0xb])(this);
      pfVar7 = (float *)operator_new__((ulong)(uVar5 & 0xfffffffc));
      this->m_raw_array_data = pfVar7;
      uVar5 = *(uint *)&(this->super_GeometryShaderRenderingCase).field_0x304;
      if (uVar5 < 3) {
        fVar16 = 2.0 / (float)(local_28 >> 0x20);
        fVar17 = 3.5 / (float)(local_28 >> 0x20);
        iVar12 = 1;
        lVar13 = 0;
        iVar14 = 0;
        do {
          fVar18 = fVar16 + fVar16 + -1.0;
          iVar15 = iVar12;
          if (uVar5 != 0) {
            if (uVar5 == 1) {
              iVar15 = iVar14 * 7 + 3;
              fVar18 = fVar17 + fVar17 + -1.0;
            }
            else {
              iVar15 = iVar14 * 6;
              fVar18 = -1.0;
            }
          }
          fVar19 = ((float)iVar15 + 0.5) / (float)(local_28 & 0xffffffff);
          *(float *)((long)pfVar7 + lVar13) = fVar19 + fVar19 + -1.0;
          *(float *)((long)pfVar7 + lVar13 + 4) = fVar18;
          *(undefined8 *)((long)pfVar7 + lVar13 + 8) = 0x3f80000000000000;
          iVar14 = iVar14 + 1;
          lVar13 = lVar13 + 0x10;
          iVar12 = iVar12 + 5;
        } while (lVar13 != 0x80);
        uVar5 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                  super_TestNode._vptr_TestNode[0xe])(this,0);
        uVar6 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                  super_TestNode._vptr_TestNode[0x10])(this,0);
        pfVar7 = (float *)operator_new__((ulong)(uVar5 & 0xfffffffc));
        this->m_unordered_array_data = pfVar7;
        puVar8 = (uchar *)operator_new__((ulong)uVar6);
        this->m_unordered_elements_data = puVar8;
        lVar13 = 0x80;
        lVar10 = 0;
        do {
          puVar2 = (undefined8 *)((long)this->m_raw_array_data + lVar13 + -0x10);
          uVar3 = puVar2[1];
          puVar1 = (undefined8 *)((long)this->m_unordered_array_data + lVar10);
          *puVar1 = *puVar2;
          puVar1[1] = uVar3;
          lVar10 = lVar10 + 0x10;
          lVar13 = lVar13 + -0x10;
        } while (lVar13 != 0);
        bVar4 = 0;
        uVar11 = 0;
        do {
          this->m_unordered_elements_data[uVar11] = (byte)(uVar11 >> 2) | bVar4 & 6;
          uVar11 = uVar11 + 1;
          bVar4 = bVar4 + 2;
        } while (uVar11 != 8);
        return;
      }
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Unsupported shader output layout qualifier requested",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x439);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,
               "Unsupported output layout qualifier type requested for \'points\' geometry shader input layout qualifier test implementation"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x3ff);
  }
  else {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,
               "Only GL_POINTS draw call mode is supported for \'points\' geometry shader input layout qualifier test implementation"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x3f8);
  }
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GeometryShaderRenderingPointsCase::GeometryShaderRenderingPointsCase(Context& context, const ExtParameters& extParams,
																	 const char* name, glw::GLenum drawcall_mode,
																	 _shader_output_type output_type)
	: GeometryShaderRenderingCase(
		  context, extParams, name,
		  "Verifies all draw calls work correctly for specific input+output+draw call mode combination")
	, m_output_type(output_type)
{
	/* Sanity checks */
	if (drawcall_mode != GL_POINTS)
	{
		TCU_FAIL("Only GL_POINTS draw call mode is supported for 'points' geometry shader input layout qualifier test "
				 "implementation");
	}

	if (output_type != SHADER_OUTPUT_TYPE_POINTS && output_type != SHADER_OUTPUT_TYPE_LINE_STRIP &&
		output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP)
	{
		TCU_FAIL("Unsupported output layout qualifier type requested for 'points' geometry shader input layout "
				 "qualifier test implementation");
	}

	/* Retrieve rendertarget resolution for a single-instance case.
	 *
	 * Y coordinates will be dynamically updated in a vertex shader for
	 * multiple-instance tests. That's fine, since in multi-instanced tests
	 * we only expand the rendertarget's height; its width is unaffected.
	 */
	unsigned int rendertarget_height = 0;
	unsigned int rendertarget_width  = 0;

	getRenderTargetSize(1, &rendertarget_width, &rendertarget_height);

	/* Generate raw vertex array data. Note we do not differentiate between instanced and
	 * non-instanced cases for geometry shaders that emit points */
	const unsigned int raw_array_data_size = getRawArraysDataBufferSize(false);

	m_raw_array_data = new float[raw_array_data_size / sizeof(float)];

	for (unsigned int n_point = 0; n_point < 8 /* points, as per test spec */; ++n_point)
	{
		switch (m_output_type)
		{
		case SHADER_OUTPUT_TYPE_LINE_STRIP:
		{
			m_raw_array_data[n_point * 4 + 0] =
				-1 + ((float(3 + 7 * n_point) + 0.5f) / float(rendertarget_width)) * 2.0f;
			m_raw_array_data[n_point * 4 + 1] = -1 + ((float(3.0f + 0.5f)) / float(rendertarget_height)) * 2.0f;
			m_raw_array_data[n_point * 4 + 2] = 0.0f;
			m_raw_array_data[n_point * 4 + 3] = 1.0f;

			break;
		}

		case SHADER_OUTPUT_TYPE_POINTS:
		{
			m_raw_array_data[n_point * 4 + 0] =
				-1 + ((float(1 + 5 * n_point) + 0.5f) / float(rendertarget_width)) * 2.0f;
			m_raw_array_data[n_point * 4 + 1] = -1 + (float(1.5f + 0.5f) / float(rendertarget_height)) * 2.0f;
			m_raw_array_data[n_point * 4 + 2] = 0.0f;
			m_raw_array_data[n_point * 4 + 3] = 1.0f;

			break;
		}

		case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
		{
			m_raw_array_data[n_point * 4 + 0] = -1 + ((float(6 * n_point) + 0.5f) / float(rendertarget_width)) * 2.0f;
			m_raw_array_data[n_point * 4 + 1] = -1.0f;
			m_raw_array_data[n_point * 4 + 2] = 0.0f;
			m_raw_array_data[n_point * 4 + 3] = 1.0f;

			break;
		}

		default:
		{
			TCU_FAIL("Unsupported shader output layout qualifier requested");
		}
		} /* switch (m_output_type) */
	}	 /* for (all points) */

	/* Generate unordered data - we do not differentiate between instanced & non-instanced cases
	 * for "points" tests
	 */
	const unsigned int unordered_array_data_size	= getUnorderedArraysDataBufferSize(false);
	const unsigned int unordered_elements_data_size = getUnorderedElementsDataBufferSize(false);

	m_unordered_array_data	= new float[unordered_array_data_size / sizeof(float)];
	m_unordered_elements_data = new unsigned char[unordered_elements_data_size];

	for (unsigned int n_point = 0; n_point < 8 /* points, as per test spec */; ++n_point)
	{
		memcpy(m_unordered_array_data + n_point * 4, m_raw_array_data + (8 - n_point - 1) * 4,
			   sizeof(float) * 4 /* components */);
	} /* for (all points) */

	for (unsigned int n_point = 0; n_point < 8 /* points, as per test spec */; ++n_point)
	{
		m_unordered_elements_data[n_point] = (unsigned char)((n_point * 2) % 8 + n_point / 4);
	} /* for (all points) */
}